

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

float * __thiscall cxxopts::OptionValue::as<float>(OptionValue *this)

{
  OptionNames *pOVar1;
  pointer pbVar2;
  pointer pcVar3;
  long lVar4;
  pointer pbVar5;
  float *pfVar6;
  element_type *peVar7;
  string local_30;
  
  peVar7 = (this->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar7 == (element_type *)0x0) {
    pOVar1 = this->m_long_names;
    if (pOVar1 == (OptionNames *)0x0) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"");
    }
    else {
      if (first_or_empty(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
          ::empty_abi_cxx11_ == '\0') {
        as<float>();
      }
      pbVar2 = (pOVar1->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar5 = (pointer)&first_or_empty(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                         ::empty_abi_cxx11_;
      if (pbVar2 != (pOVar1->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        pbVar5 = pbVar2;
      }
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      pcVar3 = (pbVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_30,pcVar3,pcVar3 + pbVar5->_M_string_length);
    }
    throw_or_mimic<cxxopts::exceptions::option_has_no_value>(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    peVar7 = (this->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  lVar4 = __dynamic_cast(peVar7,&Value::typeinfo,&values::standard_value<float>::typeinfo,0);
  if (lVar4 != 0) {
    pfVar6 = *(float **)(lVar4 + 0x28);
    if (pfVar6 == (float *)0x0) {
      pfVar6 = *(float **)(lVar4 + 0x18);
    }
    return pfVar6;
  }
  __cxa_bad_cast();
}

Assistant:

const T&
  as() const
  {
    if (m_value == nullptr) {
        throw_or_mimic<exceptions::option_has_no_value>(
            m_long_names == nullptr ? "" : first_or_empty(*m_long_names));
    }

    return CXXOPTS_RTTI_CAST<const values::standard_value<T>&>(*m_value).get();
  }